

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.c
# Opt level: O1

int kvsprintf(kstring_t *s,char *fmt,__va_list_tag *ap)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  size_t __size;
  va_list args;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  local_28 = ap->reg_save_area;
  local_38._0_4_ = ap->gp_offset;
  local_38._4_4_ = ap->fp_offset;
  pvStack_30 = ap->overflow_arg_area;
  iVar1 = vsnprintf(s->s + s->l,s->m - s->l,fmt,&local_38);
  if (s->m - s->l < (ulong)(long)(iVar1 + 1)) {
    uVar2 = (long)iVar1 + s->l + 1;
    uVar2 = uVar2 >> 1 | uVar2;
    uVar2 = uVar2 >> 2 | uVar2;
    uVar2 = uVar2 >> 4 | uVar2;
    uVar2 = uVar2 >> 8 | uVar2;
    __size = (uVar2 >> 0x10 | uVar2) + 1;
    s->m = __size;
    pcVar3 = (char *)realloc(s->s,__size);
    s->s = pcVar3;
    local_38._0_4_ = ap->gp_offset;
    local_38._4_4_ = ap->fp_offset;
    pvStack_30 = ap->overflow_arg_area;
    local_28 = ap->reg_save_area;
    iVar1 = vsnprintf(s->s + s->l,s->m - s->l,fmt,&local_38);
  }
  s->l = s->l + (long)iVar1;
  return iVar1;
}

Assistant:

int kvsprintf(kstring_t *s, const char *fmt, va_list ap)
{
	va_list args;
	int l;
	va_copy(args, ap);
	l = vsnprintf(s->s + s->l, s->m - s->l, fmt, args); // This line does not work with glibc 2.0. See `man snprintf'.
	va_end(args);
	if (l + 1 > s->m - s->l) {
		s->m = s->l + l + 2;
		kroundup32(s->m);
		s->s = (char*)realloc(s->s, s->m);
		va_copy(args, ap);
		l = vsnprintf(s->s + s->l, s->m - s->l, fmt, args);
		va_end(args);
	}
	s->l += l;
	return l;
}